

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.c
# Opt level: O3

int agent_connect_unix(LIBSSH2_AGENT *agent)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  LIBSSH2_SESSION *session;
  sockaddr_un s_un;
  sockaddr local_96 [6];
  undefined1 local_29;
  
  pcVar3 = agent->identity_agent_path;
  if (pcVar3 == (char *)0x0) {
    pcVar3 = getenv("SSH_AUTH_SOCK");
    if (pcVar3 == (char *)0x0) {
      session = agent->session;
      pcVar3 = "no auth sock variable";
      iVar1 = -0x27;
      goto LAB_001083f6;
    }
  }
  iVar2 = 0;
  iVar1 = socket(1,1,0);
  agent->fd = iVar1;
  if (-1 < iVar1) {
    local_96[0].sa_family = 1;
    strncpy(local_96[0].sa_data,pcVar3,0x6c);
    local_29 = 0;
    iVar1 = connect(iVar1,local_96,0x6e);
    if (iVar1 != 0) {
      close(agent->fd);
      iVar2 = _libssh2_error(agent->session,-0x2a,"failed connecting with agent");
    }
    return iVar2;
  }
  session = agent->session;
  pcVar3 = "failed creating socket";
  iVar1 = -0x2d;
LAB_001083f6:
  iVar1 = _libssh2_error(session,iVar1,pcVar3);
  return iVar1;
}

Assistant:

static int
agent_connect_unix(LIBSSH2_AGENT *agent)
{
    const char *path;
    struct sockaddr_un s_un;

    path = agent->identity_agent_path;
    if(!path) {
        path = getenv("SSH_AUTH_SOCK");
        if(!path)
            return _libssh2_error(agent->session, LIBSSH2_ERROR_BAD_USE,
                                  "no auth sock variable");
    }

    agent->fd = socket(PF_UNIX, SOCK_STREAM, 0);
    if(agent->fd < 0)
        return _libssh2_error(agent->session, LIBSSH2_ERROR_BAD_SOCKET,
                              "failed creating socket");

    s_un.sun_family = AF_UNIX;
    strncpy(s_un.sun_path, path, sizeof(s_un.sun_path));
    s_un.sun_path[sizeof(s_un.sun_path)-1] = 0; /* make sure there's a trailing
                                                   zero */
    if(connect(agent->fd, (struct sockaddr*)(&s_un), sizeof(s_un)) != 0) {
        close(agent->fd);
        return _libssh2_error(agent->session, LIBSSH2_ERROR_AGENT_PROTOCOL,
                              "failed connecting with agent");
    }

    return LIBSSH2_ERROR_NONE;
}